

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O0

void pacify_guards(void)

{
  monst *local_10;
  monst *mtmp;
  
  for (local_10 = level->monlist; local_10 != (monst *)0x0; local_10 = local_10->nmon) {
    if ((0 < local_10->mhp) &&
       ((local_10->data == mons + 0x125 || (local_10->data == mons + 0x126)))) {
      *(uint *)&local_10->field_0x60 = *(uint *)&local_10->field_0x60 & 0xffbfffff | 0x400000;
    }
  }
  return;
}

Assistant:

void pacify_guards(void)
{
	struct monst *mtmp;

	for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon) {
	    if (DEADMONSTER(mtmp)) continue;
	    if (mtmp->data == &mons[PM_WATCHMAN] ||
		mtmp->data == &mons[PM_WATCH_CAPTAIN])
	    mtmp->mpeaceful = 1;
	}
}